

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Header.cpp
# Opt level: O3

void __thiscall Header::Header(Header *this,path *path)

{
  size_type sVar1;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> _Var2;
  uint16_t uVar3;
  uint uVar4;
  long lVar5;
  
  (this->m_fileContents)._M_dataplus._M_p = (pointer)&(this->m_fileContents).field_2;
  (this->m_fileContents)._M_string_length = 0;
  (this->m_fileContents).field_2._M_local_buf[0] = '\0';
  (this->m_dependancies)._M_h._M_buckets = &(this->m_dependancies)._M_h._M_single_bucket;
  (this->m_dependancies)._M_h._M_bucket_count = 1;
  (this->m_dependancies)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_dependancies)._M_h._M_element_count = 0;
  (this->m_dependancies)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_dependancies)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_dependancies)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::filesystem::__cxx11::path::path(&this->m_fullPath,path);
  sVar1 = (path->_M_pathname)._M_string_length;
  if (sVar1 != 0) {
    _Var2._M_head_impl =
         (path->_M_cmpts)._M_impl._M_t.
         super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         ._M_t.
         super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl;
    uVar4 = (uint)_Var2._M_head_impl;
    if ((~(byte)_Var2._M_head_impl & 3) == 0) {
LAB_00106885:
      std::filesystem::__cxx11::path::path(&this->m_fileName,path);
      goto LAB_0010689a;
    }
    if ((((ulong)_Var2._M_head_impl & 3) == 0) &&
       ((path->_M_pathname)._M_dataplus._M_p[sVar1 - 1] != '/')) {
      if (((ulong)_Var2._M_head_impl & 3) == 0) {
        lVar5 = std::filesystem::__cxx11::path::_List::end();
        if (((ulong)(path->_M_cmpts)._M_impl._M_t.
                    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                    _M_head_impl & 3) == 0) {
          path = (path *)(lVar5 + -0x30);
        }
        uVar4 = (uint)(path->_M_cmpts)._M_impl._M_t.
                      super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                      .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                      _M_head_impl;
      }
      if ((~uVar4 & 3) == 0) goto LAB_00106885;
    }
  }
  std::filesystem::__cxx11::path::path(&this->m_fileName);
LAB_0010689a:
  uVar3 = id + 1;
  this->m_id = id;
  id = uVar3;
  return;
}

Assistant:

Header::Header(const fs::path & path)
    :   m_fullPath  (path)
    ,   m_fileName  (path.filename())
    ,   m_id        (id++)
{ }